

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr_wrapper.hpp
# Opt level: O3

string * __thiscall
attr_wrapper::get_attribute<std::__cxx11::string>
          (string *__return_storage_ptr__,attr_wrapper *this,Value *doc,char *name)

{
  SizeType SVar1;
  ConstMemberIterator CVar2;
  Ch *pCVar3;
  Type_error *__return_storage_ptr___00;
  allocator local_61;
  string local_60;
  string local_40;
  
  CVar2 = get_loc((Value *)this,(char *)doc);
  if ((((CVar2.ptr_)->value).flags_ & 0x100000) != 0) {
    pCVar3 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(&(CVar2.ptr_)->value);
    SVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetStringLength(&(CVar2.ptr_)->value);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pCVar3,pCVar3 + SVar1);
    return __return_storage_ptr__;
  }
  __return_storage_ptr___00 = (Type_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_40,(char *)doc,&local_61);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60," string","");
  genTypeError(__return_storage_ptr___00,&local_40,&local_60);
  __cxa_throw(__return_storage_ptr___00,&Type_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline std::string get_attribute<std::string>(const rapidjson::Value& doc,
                                                 const char* name)
   {
      auto loc = get_loc(doc, name);
      if(!loc->value.IsString())
      {
         throw genTypeError(name, " string");
      }
      return std::string(loc->value.GetString(), loc->value.GetStringLength());
   }